

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

void __thiscall
capnp::compiler::CompilerMain::setRootType::CliArgumentErrorReporter::~CliArgumentErrorReporter
          (CliArgumentErrorReporter *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  (this->super_ErrorReporter)._vptr_ErrorReporter = (_func_int **)&PTR_StringPtr__0027a9a0;
  if (((this->error).ptr.isSet == true) &&
     (pcVar1 = (this->error).ptr.field_1.value.content.ptr, pcVar1 != (char *)0x0)) {
    sVar2 = (this->error).ptr.field_1.value.content.size_;
    (this->error).ptr.field_1.value.content.ptr = (char *)0x0;
    (this->error).ptr.field_1.value.content.size_ = 0;
    pAVar3 = (this->error).ptr.field_1.value.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
        if (startByte < endByte) {
          error = kj::str(startByte + 1, "-", endByte, ": ", message);
        } else if (startByte > 0) {
          error = kj::str(startByte + 1, ": ", message);
        } else {
          error = kj::str(message);
        }
      }